

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc-time.c
# Opt level: O3

uint64_t rtosc_float2secfracs(float secfracsf)

{
  ushort **ppuVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  ulong uVar6;
  char secfracs_as_hex [32];
  int exp;
  char local_58 [2];
  char local_56;
  char local_55 [41];
  char local_2c [4];
  long local_28;
  
  snprintf(local_58,0x20,"%a",(double)secfracsf);
  uVar6 = (ulong)(local_58[0] == '-');
  if (local_55[uVar6] != '.') goto LAB_00117df1;
  cVar4 = local_55[uVar6 + 1];
  pcVar3 = local_55 + uVar6 + 1;
  if (cVar4 == '\0') {
LAB_00117dd2:
    pcVar5 = local_55 + uVar6;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    pcVar5 = (char *)0x0;
    do {
      if ((*(byte *)((long)*ppuVar1 + (long)cVar4 * 2 + 1) & 0x10) == 0) break;
      if (cVar4 != '0') {
        pcVar5 = pcVar3;
      }
      cVar4 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
    if (pcVar5 == (char *)0x0) goto LAB_00117dd2;
    pcVar5 = pcVar5 + 1;
    if (pcVar5 == pcVar3) goto LAB_00117df1;
  }
  sVar2 = strlen(pcVar3);
  memmove(pcVar5,pcVar3,sVar2 + 1);
LAB_00117df1:
  if (local_55[0] == '.') {
    pcVar3 = local_55;
    local_55[0] = local_56;
  }
  else {
    pcVar3 = &local_56;
  }
  pcVar5 = strstr(local_58,"+0");
  if ((pcVar5 == (char *)0x0) || (pcVar5[2] != '\0')) {
    __isoc99_sscanf(pcVar3,"%lxp-%i",&local_28,local_2c);
  }
  else {
    local_28 = 0;
    local_2c[0] = '\0';
  }
  pcVar5 = strchr(local_58,0x70);
  return local_28 << ((((char)pcVar3 - (char)pcVar5) * '\x04' - local_2c[0]) + 0x24U & 0x3f);
}

Assistant:

uint64_t rtosc_float2secfracs(float secfracsf)
{
    char secfracs_as_hex[32];
    // print float in hex representation (lossless)
    int written = snprintf(secfracs_as_hex, 32, "%a", secfracsf);
    // examples:
    // 0.85 => 0x1.b33334p-1
    // 0.51 => 0x1.051eb8p-1
    // 0.5  => 0x8p-4
    remove_trailing_zeroes(secfracs_as_hex);

    assert(written >= 0); // no error
    assert(written < (int)sizeof(secfracs_as_hex)); // size suffices
    (void) written;
    int scanpos;
    if(secfracs_as_hex[3]=='.') // 0x?.???
    {
        secfracs_as_hex[3] = secfracs_as_hex[2]; // remove '.'
        scanpos = 3;
    }
    else
    {
        scanpos = 2;
    }
    uint64_t secfracs;
    int exp;
    const char* plus;
    if((plus = strstr(secfracs_as_hex, "+0")) && !plus[2])
    {
        // exponent with plus sign, does not match the scanf below
        secfracs = exp = 0;
    }
    else
    {
        int scanned = sscanf(secfracs_as_hex + scanpos,
                             "%"PRIx64"p-%i" /* expands to like "%lxp-%i" */,
                             &secfracs, &exp);
#ifdef NDEBUG
        (void)scanned;
#else
        assert(scanned == 2);
#endif
    }
    const char* p = strchr(secfracs_as_hex, 'p');
    assert(p);
    int hexdigits_after_comma = p-(secfracs_as_hex+scanpos+1);

    /*
       Remember that
       (1) shifting a comma over one hex digits multiplies/divides by 4
       (2) that secfracsf was scanned as "%a"
       (3) 0x00000001 counts as one secfrac and 0x100000000 would equal 1,
           which means one secfrac is 2^-32
       Then, we get:
                      base_without_comma*2^(-exp-4*hexdigits_after_comma)
       (with (1))   = base_with_comma*2^-exp
       (with (2))   = secfracsf
       (with (3))   = secfracs*2^-32
       <=> secfracs = base_without_comma * 2^(32-exp-4*hexdigits_after_comma)
    */
    int lshift = 32-exp-(hexdigits_after_comma<<2);
    assert(lshift > 0);
    secfracs <<= lshift;
    assert((secfracs & 0xFFFFFFFF) == secfracs);

    return secfracs;
}